

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Field * __thiscall
capnp::StructSchema::getFieldByName(Field *__return_storage_ptr__,StructSchema *this,StringPtr name)

{
  NullableValue<capnp::StructSchema::Field> *other;
  Field *pFVar1;
  Fault local_e0;
  Fault f;
  Maybe<capnp::StructSchema::Field> local_b0;
  undefined1 local_68 [8];
  NullableValue<capnp::StructSchema::Field> member;
  StructSchema *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (StructSchema *)name.content.ptr;
  member.field_1._56_8_ = this;
  findFieldByName(&local_b0,this,name);
  other = kj::_::readMaybe<capnp::StructSchema::Field>(&local_b0);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_68,other);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_b0);
  pFVar1 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_68);
  if (pFVar1 != (Field *)0x0) {
    pFVar1 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                       ((NullableValue<capnp::StructSchema::Field> *)local_68);
    memcpy(__return_storage_ptr__,pFVar1,0x40);
    kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
              ((NullableValue<capnp::StructSchema::Field> *)local_68);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::StringPtr&>
            (&local_e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
             ,0x1ec,FAILED,(char *)0x0,"\"struct has no such member\", name",
             (char (*) [26])"struct has no such member",(StringPtr *)&this_local);
  kj::_::Debug::Fault::fatal(&local_e0);
}

Assistant:

StructSchema::Field StructSchema::getFieldByName(kj::StringPtr name) const {
  KJ_IF_MAYBE(member, findFieldByName(name)) {
    return *member;
  } else {
    KJ_FAIL_REQUIRE("struct has no such member", name);
  }